

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprite.cpp
# Opt level: O0

void __thiscall
piksel::Sprite::draw
          (Sprite *this,Graphics *g,float dx,float dy,float dWidth,float dHeight,
          bool flipHorizontally,bool flipVertically,bool flipDiagonally)

{
  int iVar1;
  int iVar2;
  float local_a0;
  float local_94;
  float local_68;
  float local_5c;
  bool flipDiagonally_local;
  bool flipVertically_local;
  bool flipHorizontally_local;
  float dHeight_local;
  float dWidth_local;
  float dy_local;
  float dx_local;
  Graphics *g_local;
  Sprite *this_local;
  
  if (flipDiagonally) {
    Graphics::push(g);
    Graphics::imageMode(g,CENTER);
    Graphics::translate(g,dx + dWidth / 2.0,dy + dHeight / 2.0);
    Graphics::rotate(g,HALF_PI);
    if (flipVertically) {
      local_5c = this->sWidth;
    }
    else {
      local_5c = 0.0;
    }
    if (flipHorizontally) {
      local_68 = 0.0;
    }
    else {
      local_68 = this->sHeight;
    }
    iVar2 = 1;
    if (flipVertically) {
      iVar2 = -1;
    }
    iVar1 = 1;
    if (((flipHorizontally ^ 0xffU) & 1) != 0) {
      iVar1 = -1;
    }
    Graphics::image(g,this->img,0.0,0.0,dWidth,dHeight,this->sx + local_5c,this->sy + local_68,
                    this->sWidth * (float)iVar2,this->sHeight * (float)iVar1);
    Graphics::pop(g);
  }
  else {
    if (flipHorizontally) {
      local_94 = this->sWidth;
    }
    else {
      local_94 = 0.0;
    }
    if (flipVertically) {
      local_a0 = this->sHeight;
    }
    else {
      local_a0 = 0.0;
    }
    iVar2 = 1;
    if (flipHorizontally) {
      iVar2 = -1;
    }
    iVar1 = 1;
    if (flipVertically) {
      iVar1 = -1;
    }
    Graphics::image(g,this->img,dx,dy,dWidth,dHeight,this->sx + local_94,this->sy + local_a0,
                    this->sWidth * (float)iVar2,this->sHeight * (float)iVar1);
  }
  return;
}

Assistant:

void Sprite::draw(Graphics& g, float dx, float dy, float dWidth, float dHeight, bool flipHorizontally, bool flipVertically, bool flipDiagonally) {
    if (flipDiagonally) {
        g.push();
        g.imageMode(DrawMode::CENTER);
        g.translate(dx + dWidth / 2.0f, dy + dHeight / 2.0f);
        g.rotate(HALF_PI);
        g.image(img, 0, 0, dWidth, dHeight, sx + (flipVertically ? sWidth : 0), sy + (!flipHorizontally ? sHeight : 0), sWidth * (flipVertically ? -1 : 1), sHeight * (!flipHorizontally ? -1 : 1));
        g.pop();
    } else {
        g.image(img, dx, dy, dWidth, dHeight, sx + (flipHorizontally ? sWidth : 0), sy + (flipVertically ? sHeight : 0), sWidth * (flipHorizontally ? -1 : 1), sHeight * (flipVertically ? -1 : 1));
    }
}